

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  uint _c;
  uint uVar4;
  size_t _elemsize;
  int i;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  void *pvVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int k;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  void *pvVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  float fVar25;
  void *local_198;
  long local_188;
  int local_170;
  Mat bottom_blob_bordered;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat local_78;
  
  iVar19 = bottom_blob->w;
  iVar7 = bottom_blob->h;
  _c = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      bottom_blob_bordered.cstep = 0;
      bottom_blob_bordered.data = (void *)0x0;
      bottom_blob_bordered.refcount._0_4_ = 0;
      bottom_blob_bordered.refcount._4_4_ = 0;
      bottom_blob_bordered.elemsize._0_4_ = 0;
      bottom_blob_bordered._20_8_ = 0;
      bottom_blob_bordered.allocator = (Allocator *)0x0;
      bottom_blob_bordered.dims = 0;
      bottom_blob_bordered.w = 0;
      bottom_blob_bordered.h = 0;
      bottom_blob_bordered.d = 0;
      bottom_blob_bordered.c = 0;
      make_padding(this,bottom_blob,&bottom_blob_bordered,opt);
      iVar8 = bottom_blob_bordered.h;
      iVar7 = bottom_blob_bordered.w;
      iVar19 = -100;
      if ((bottom_blob_bordered.data != (void *)0x0) &&
         ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
        iVar15 = (bottom_blob_bordered.w - this->kernel_w) / this->stride_w;
        iVar16 = (bottom_blob_bordered.h - this->kernel_h) / this->stride_h;
        iVar5 = iVar15 + 1;
        Mat::create(top_blob,iVar5,iVar16 + 1,_c,_elemsize,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar20 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar20,(allocator_type *)&m);
          iVar19 = this->kernel_w;
          iVar10 = iVar7 - iVar19;
          lVar12 = 0;
          iVar6 = 0;
          for (iVar11 = 0; iVar11 < this->kernel_h; iVar11 = iVar11 + 1) {
            for (lVar24 = 0; iVar22 = (int)lVar24, iVar22 < iVar19; lVar24 = lVar24 + 1) {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)lVar12 + lVar24] = iVar6 + iVar22;
              iVar19 = this->kernel_w;
            }
            iVar6 = iVar6 + iVar10 + iVar22;
            lVar12 = (int)lVar12 + lVar24;
          }
          iVar19 = (int)uVar20;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar10 = 0;
              iVar19 = 0;
              if (this->pad_mode == 0) {
                iVar10 = (bottom_blob->w - bottom_blob_bordered.w) + this->pad_left +
                         this->pad_right;
                iVar19 = (bottom_blob->h - bottom_blob_bordered.h) + this->pad_top +
                         this->pad_bottom;
              }
              if ((int)_c < 1) {
                _c = 0;
              }
              for (uVar14 = 0; uVar14 != _c; uVar14 = uVar14 + 1) {
                Mat::channel(&m,&bottom_blob_bordered,uVar14);
                Mat::channel(&local_78,top_blob,uVar14);
                local_198 = local_78.data;
                Mat::~Mat(&local_78);
                iVar6 = this->stride_h;
                local_188 = 0;
                for (lVar12 = 0; lVar12 <= iVar16; lVar12 = lVar12 + 1) {
                  iVar11 = this->stride_w;
                  uVar4 = this->kernel_h;
                  if (this->kernel_h < 1) {
                    uVar4 = 0;
                  }
                  lVar24 = 0;
                  for (lVar18 = 0; lVar18 <= iVar15; lVar18 = lVar18 + 1) {
                    uVar23 = 0;
                    uVar20 = (ulong)(uint)this->kernel_w;
                    if (this->kernel_w < 1) {
                      uVar20 = uVar23;
                    }
                    pvVar13 = (void *)((long)m.w * m.elemsize * local_188 + (long)m.data);
                    fVar25 = 0.0;
                    iVar22 = 0;
                    for (; uVar23 != uVar4; uVar23 = uVar23 + 1) {
                      lVar2 = uVar23 + lVar12 * iVar6;
                      if (this->pad_top <= lVar2) {
                        uVar9 = uVar20;
                        lVar17 = lVar24;
                        if ((iVar19 + iVar8) - this->pad_bottom <= lVar2) break;
                        while (uVar9 != 0) {
                          if (this->pad_left <= lVar17) {
                            if ((iVar10 + iVar7) - this->pad_right <= lVar17) break;
                            fVar25 = fVar25 + *(float *)((long)pvVar13 + lVar17 * 4);
                            iVar22 = iVar22 + 1;
                          }
                          uVar9 = uVar9 - 1;
                          lVar17 = lVar17 + 1;
                        }
                      }
                      pvVar13 = (void *)((long)pvVar13 + (long)m.w * m.elemsize);
                    }
                    *(float *)((long)local_198 + lVar18 * 4) = fVar25 / (float)iVar22;
                    lVar24 = lVar24 + iVar11;
                  }
                  local_198 = (void *)((long)local_198 + (long)iVar5 * 4);
                  local_188 = local_188 + iVar6;
                }
                Mat::~Mat(&m);
              }
            }
            else {
              uVar23 = 0;
              uVar20 = uVar20 & 0xffffffff;
              if (iVar19 < 1) {
                uVar20 = uVar23;
              }
              uVar9 = (ulong)_c;
              if ((int)_c < 1) {
                uVar9 = uVar23;
              }
              while( true ) {
                local_170 = (int)uVar9;
                iVar7 = (int)uVar23;
                if (iVar7 == local_170) break;
                Mat::channel(&m,&bottom_blob_bordered,iVar7);
                Mat::channel(&local_78,top_blob,iVar7);
                pvVar13 = local_78.data;
                Mat::~Mat(&local_78);
                for (iVar8 = 0; iVar8 <= iVar16; iVar8 = iVar8 + 1) {
                  iVar10 = this->stride_h;
                  iVar6 = this->stride_w;
                  for (lVar12 = 0; lVar12 <= iVar15; lVar12 = lVar12 + 1) {
                    fVar25 = 0.0;
                    for (uVar23 = 0; uVar20 != uVar23; uVar23 = uVar23 + 1) {
                      fVar25 = fVar25 + *(float *)((long)m.data +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar23] *
                                                  4 + lVar12 * iVar6 * 4 +
                                                      (long)m.w * (long)iVar8 * (long)iVar10 *
                                                      m.elemsize);
                    }
                    *(float *)((long)pvVar13 + lVar12 * 4) = fVar25 * (1.0 / (float)iVar19);
                  }
                  pvVar13 = (void *)((long)pvVar13 + (long)iVar5 * 4);
                }
                Mat::~Mat(&m);
                uVar23 = (ulong)(iVar7 + 1);
              }
            }
          }
          else if (this->pooling_type == 0) {
            uVar23 = 0;
            uVar20 = uVar20 & 0xffffffff;
            if (iVar19 < 1) {
              uVar20 = uVar23;
            }
            uVar9 = (ulong)_c;
            if ((int)_c < 1) {
              uVar9 = uVar23;
            }
            while( true ) {
              local_170 = (int)uVar9;
              iVar19 = (int)uVar23;
              if (iVar19 == local_170) break;
              Mat::channel(&m,&bottom_blob_bordered,iVar19);
              Mat::channel(&local_78,top_blob,iVar19);
              pvVar13 = local_78.data;
              Mat::~Mat(&local_78);
              for (iVar7 = 0; iVar7 <= iVar16; iVar7 = iVar7 + 1) {
                iVar8 = this->stride_h;
                iVar10 = this->stride_w;
                for (lVar12 = 0; lVar12 <= iVar15; lVar12 = lVar12 + 1) {
                  pfVar1 = (float *)((long)m.data +
                                    lVar12 * iVar10 * 4 +
                                    (long)m.w * (long)iVar7 * (long)iVar8 * m.elemsize);
                  fVar25 = *pfVar1;
                  for (uVar23 = 0; uVar20 != uVar23; uVar23 = uVar23 + 1) {
                    fVar3 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar23]];
                    if (fVar25 <= fVar3) {
                      fVar25 = fVar3;
                    }
                  }
                  *(float *)((long)pvVar13 + lVar12 * 4) = fVar25;
                }
                pvVar13 = (void *)((long)pvVar13 + (long)iVar5 * 4);
              }
              Mat::~Mat(&m);
              uVar23 = (ulong)(iVar19 + 1);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
          iVar19 = 0;
        }
      }
      Mat::~Mat(&bottom_blob_bordered);
      return iVar19;
    }
    Mat::create(top_blob,this->out_w,this->out_h,_c,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      if ((int)_c < 1) {
        _c = 0;
      }
      lVar12 = (long)iVar19 * 4;
      for (uVar14 = 0; uVar14 != _c; uVar14 = uVar14 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,uVar14);
        pvVar13 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        Mat::channel(&bottom_blob_bordered,top_blob,uVar14);
        local_198 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        iVar8 = this->out_h;
        uVar4 = this->out_w;
        iVar16 = 0;
        uVar20 = 0;
        if (0 < (int)uVar4) {
          uVar20 = (ulong)uVar4;
        }
        iVar15 = 0;
        if (0 < iVar8) {
          iVar15 = iVar8;
        }
        while (iVar16 != iVar15) {
          iVar5 = (iVar16 * iVar7) / iVar8;
          iVar16 = iVar16 + 1;
          uVar23 = 0;
          while (uVar23 != uVar20) {
            iVar10 = ((int)uVar23 * iVar19) / (int)uVar4;
            fVar25 = *(float *)((long)pvVar13 + (long)(iVar10 + iVar19 * iVar5) * 4);
            pvVar21 = (void *)(lVar12 * iVar5 + (long)pvVar13);
            for (lVar24 = (long)iVar5; lVar18 = (long)iVar10,
                lVar24 < (iVar16 * iVar7 + iVar8 + -1) / iVar8; lVar24 = lVar24 + 1) {
              for (; lVar18 < (int)((int)(uVar23 + 1) * iVar19 + (uVar4 - 1)) / (int)uVar4;
                  lVar18 = lVar18 + 1) {
                fVar3 = *(float *)((long)pvVar21 + lVar18 * 4);
                if (fVar25 <= fVar3) {
                  fVar25 = fVar3;
                }
              }
              pvVar21 = (void *)((long)pvVar21 + lVar12);
            }
            *(float *)((long)local_198 + uVar23 * 4) = fVar25;
            uVar23 = uVar23 + 1;
          }
          local_198 = (void *)((long)local_198 + (long)(int)uVar4 * 4);
        }
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      if ((int)_c < 1) {
        _c = 0;
      }
      lVar12 = (long)iVar19 * 4;
      for (uVar14 = 0; uVar14 != _c; uVar14 = uVar14 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,uVar14);
        pvVar13 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        Mat::channel(&bottom_blob_bordered,top_blob,uVar14);
        local_198 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        iVar8 = this->out_h;
        uVar4 = this->out_w;
        iVar16 = 0;
        uVar20 = 0;
        if (0 < (int)uVar4) {
          uVar20 = (ulong)uVar4;
        }
        iVar15 = 0;
        if (0 < iVar8) {
          iVar15 = iVar8;
        }
        while (iVar16 != iVar15) {
          iVar10 = (iVar16 * iVar7) / iVar8;
          iVar16 = iVar16 + 1;
          iVar5 = (iVar16 * iVar7 + iVar8 + -1) / iVar8;
          uVar23 = 0;
          while (uVar23 != uVar20) {
            iVar11 = ((int)uVar23 * iVar19) / (int)uVar4;
            iVar6 = (int)((int)(uVar23 + 1) * iVar19 + (uVar4 - 1)) / (int)uVar4;
            fVar25 = 0.0;
            pvVar21 = (void *)(lVar12 * iVar10 + (long)pvVar13);
            for (lVar24 = (long)iVar10; lVar18 = (long)iVar11, lVar24 < iVar5; lVar24 = lVar24 + 1)
            {
              for (; lVar18 < iVar6; lVar18 = lVar18 + 1) {
                fVar25 = fVar25 + *(float *)((long)pvVar21 + lVar18 * 4);
              }
              pvVar21 = (void *)((long)pvVar21 + lVar12);
            }
            *(float *)((long)local_198 + uVar23 * 4) =
                 fVar25 / ((float)(iVar6 - iVar11) * (float)(iVar5 - iVar10));
            uVar23 = uVar23 + 1;
          }
          local_198 = (void *)((long)local_198 + (long)(int)uVar4 * 4);
        }
      }
      return 0;
    }
  }
  else {
    Mat::create(top_blob,_c,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar14 = iVar7 * iVar19;
    if (this->pooling_type == 1) {
      uVar4 = uVar14;
      if ((int)uVar14 < 1) {
        uVar4 = 0;
      }
      uVar20 = (ulong)_c;
      if ((int)_c < 1) {
        uVar20 = 0;
      }
      for (uVar23 = 0; uVar23 != uVar20; uVar23 = uVar23 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar23);
        pvVar13 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        fVar25 = 0.0;
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          fVar25 = fVar25 + *(float *)((long)pvVar13 + uVar9 * 4);
        }
        *(float *)((long)top_blob->data + uVar23 * 4) = fVar25 * (1.0 / (float)(int)uVar14);
      }
      return 0;
    }
    if (this->pooling_type == 0) {
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      uVar20 = (ulong)_c;
      if ((int)_c < 1) {
        uVar20 = 0;
      }
      for (uVar23 = 0; uVar23 != uVar20; uVar23 = uVar23 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar23);
        pvVar13 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        fVar25 = *pvVar13;
        for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
          fVar3 = *(float *)((long)pvVar13 + uVar9 * 4);
          if (fVar25 <= fVar3) {
            fVar25 = fVar3;
          }
        }
        *(float *)((long)top_blob->data + uVar23 * 4) = fVar25;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}